

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

path * __thiscall ArgsManager::GetBlocksDirPath(path *__return_storage_ptr__,ArgsManager *this)

{
  path *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string arg;
  bool bVar2;
  char cVar3;
  CBaseChainParams *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  ArgsManager *pAVar5;
  bool bVar6;
  undefined7 in_stack_ffffffffffffff01;
  _Alloc_hider _Var7;
  size_type sVar8;
  undefined1 local_d0 [72];
  path local_88;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = false;
  pAVar5 = this;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffef8);
  this_00 = &this->m_cached_blocks_path;
  if ((this->m_cached_blocks_path).super_path._M_pathname._M_string_length == 0) {
    paVar1 = &local_60._M_pathname.field_2;
    local_60._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"-blocksdir","");
    bVar2 = IsArgSet(this,&local_60._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_pathname._M_dataplus._M_p,
                      local_60._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_d0._0_8_ = local_d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"-blocksdir","");
      _Var7._M_p = (pointer)0x0;
      sVar8 = 0;
      std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff08);
      arg._M_string_length._0_1_ = bVar6;
      arg._M_dataplus._M_p = (pointer)pAVar5;
      arg._M_string_length._1_7_ = in_stack_ffffffffffffff01;
      arg.field_2._M_allocated_capacity = (size_type)_Var7._M_p;
      arg.field_2._8_8_ = sVar8;
      GetPathArg((path *)(local_d0 + 0x20),this,arg,(path *)local_d0);
      std::filesystem::absolute(&local_60);
      std::filesystem::__cxx11::path::path(&local_88,&local_60);
      std::filesystem::__cxx11::path::~path(&local_60);
      if (&local_88 != &this_00->super_path) {
        GetBlocksDirPath();
      }
      std::filesystem::__cxx11::path::~path(&local_88);
      std::filesystem::__cxx11::path::~path((path *)(local_d0 + 0x20));
      std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff08);
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      cVar3 = std::filesystem::status(&this_00->super_path);
      if (cVar3 != '\x02') {
        local_60._M_pathname._M_dataplus._M_p = "";
        std::filesystem::__cxx11::path::operator=(&this_00->super_path,(char **)&local_60);
        goto LAB_0066648d;
      }
    }
    else {
      GetDataDir((path *)&local_60,this,false);
      if (&local_60 != &this_00->super_path) {
        GetBlocksDirPath();
      }
      std::filesystem::__cxx11::path::~path(&local_60);
    }
    pCVar4 = BaseParams();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_60,&pCVar4->strDataDir,auto_format);
    std::filesystem::__cxx11::path::path(&local_88,&local_60);
    std::filesystem::__cxx11::path::~path(&local_60);
    std::filesystem::__cxx11::path::operator/=(&this_00->super_path,&local_88);
    std::filesystem::__cxx11::path::~path(&local_88);
    std::filesystem::__cxx11::path::_M_append(this_00,6,"blocks");
    cVar3 = std::filesystem::symlink_status(&this_00->super_path);
    if (cVar3 == '\x03') {
      cVar3 = std::filesystem::status(&this_00->super_path);
      if (cVar3 == '\x02') goto LAB_0066648d;
    }
    std::filesystem::create_directories(&this_00->super_path);
  }
LAB_0066648d:
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&this_00->super_path);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

fs::path ArgsManager::GetBlocksDirPath() const
{
    LOCK(cs_args);
    fs::path& path = m_cached_blocks_path;

    // Cache the path to avoid calling fs::create_directories on every call of
    // this function
    if (!path.empty()) return path;

    if (IsArgSet("-blocksdir")) {
        path = fs::absolute(GetPathArg("-blocksdir"));
        if (!fs::is_directory(path)) {
            path = "";
            return path;
        }
    } else {
        path = GetDataDirBase();
    }

    path /= fs::PathFromString(BaseParams().DataDir());
    path /= "blocks";
    fs::create_directories(path);
    return path;
}